

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void ungroup_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__filename;
  bool bVar2;
  Fl_Type *nxt;
  Fl_Type *n;
  Fl_Type *q;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  n = Fl_Type::current;
  __filename = (char *)param_2;
  while( true ) {
    bVar2 = false;
    if (n != (Fl_Type *)0x0) {
      iVar1 = (*n->_vptr_Fl_Type[0x17])();
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = (*n->_vptr_Fl_Type[0x1e])();
        bVar2 = iVar1 != 0;
      }
    }
    if (!bVar2) break;
    n = n->parent;
  }
  if (n != (Fl_Type *)0x0) {
    n = n->parent;
  }
  if ((n == (Fl_Type *)0x0) || (n->level < 1)) {
LAB_0018cda2:
    fl_message("Please select widgets in a group");
  }
  else {
    if (n->level == 1) {
      iVar1 = (*n->_vptr_Fl_Type[5])();
      __filename = "widget_class";
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"widget_class");
      if (iVar1 == 0) goto LAB_0018cda2;
    }
    nxt = n->next;
    while( true ) {
      bVar2 = false;
      if (nxt != (Fl_Type *)0x0) {
        bVar2 = n->level < nxt->level;
      }
      if (!bVar2) {
        nxt = n->next;
        while( true ) {
          bVar2 = false;
          if (nxt != (Fl_Type *)0x0) {
            bVar2 = n->level < nxt->level;
          }
          if (!bVar2) break;
          iVar1 = Fl_Type::remove(nxt,__filename);
          __filename = (char *)n;
          Fl_Type::insert(nxt,n);
          nxt = (Fl_Type *)CONCAT44(extraout_var_00,iVar1);
        }
        if (n == (Fl_Type *)0x0) {
          return;
        }
        (*n->_vptr_Fl_Type[2])();
        return;
      }
      if ((nxt->level == n->level + 1) && (nxt->selected == '\0')) break;
      nxt = nxt->next;
    }
    fl_message("Please select all widgets in group");
  }
  return;
}

Assistant:

void ungroup_cb(Fl_Widget *, void *) {
  // Find the group:
  Fl_Type *q = Fl_Type::current;
  while (q && (!q->is_widget() || q->is_menu_item())) q = q->parent;
  if (q) q = q->parent;
  if (!q || q->level < 1 || (q->level == 1 && !strcmp(q->type_name(), "widget_class"))) {
    fl_message("Please select widgets in a group");
    return;
  }
  Fl_Type* n;
  for (n = q->next; n && n->level > q->level; n = n->next) {
    if (n->level == q->level+1 && !n->selected) {
      fl_message("Please select all widgets in group");
      return;
    }
  }
  for (n = q->next; n && n->level > q->level;) {
    Fl_Type *nxt = n->remove();
    n->insert(q);
    n = nxt;
  }
  delete q;
}